

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mc2b.cc
# Opt level: O2

void anon_unknown.dwarf_2b03::PrintUsage(ostream *stream)

{
  long lVar1;
  ostream *poVar2;
  
  std::endl<char,std::char_traits<char>>(stream);
  poVar2 = std::operator<<(stream," mc2b - convert mel-cepstrum to MLSA digital filter coefficients"
                          );
  std::endl<char,std::char_traits<char>>(poVar2);
  std::endl<char,std::char_traits<char>>(stream);
  poVar2 = std::operator<<(stream,"  usage:");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(stream,"       mc2b [ options ] [ infile ] > stdout");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(stream,"  options:");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(stream,"       -m m  : order of mel-cepstrum (   int)[");
  lVar1 = *(long *)poVar2;
  *(undefined8 *)(poVar2 + *(long *)(lVar1 + -0x18) + 0x10) = 5;
  lVar1 = *(long *)(lVar1 + -0x18);
  *(uint *)(poVar2 + lVar1 + 0x18) = *(uint *)(poVar2 + lVar1 + 0x18) & 0xffffff4f | 0x80;
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x19);
  poVar2 = std::operator<<(poVar2,"][    0 <= m <=     ]");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(stream,"       -a a  : all-pass constant     (double)[");
  lVar1 = *(long *)poVar2;
  *(undefined8 *)(poVar2 + *(long *)(lVar1 + -0x18) + 0x10) = 5;
  lVar1 = *(long *)(lVar1 + -0x18);
  *(uint *)(poVar2 + lVar1 + 0x18) = *(uint *)(poVar2 + lVar1 + 0x18) & 0xffffff4f | 0x80;
  poVar2 = std::ostream::_M_insert<double>(0.35);
  poVar2 = std::operator<<(poVar2,"][ -1.0 <  a <  1.0 ]");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(stream,"       -h    : print this message");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(stream,"  infile:");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(stream,"       mel-cepstrum                  (double)[stdin]");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(stream,"  stdout:");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(stream,"       MLSA filter coefficients      (double)");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::endl<char,std::char_traits<char>>(stream);
  poVar2 = std::operator<<(stream," SPTK: version ");
  poVar2 = std::operator<<(poVar2,"4.3");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::endl<char,std::char_traits<char>>(stream);
  return;
}

Assistant:

void PrintUsage(std::ostream* stream) {
  // clang-format off
  *stream << std::endl;
  *stream << " mc2b - convert mel-cepstrum to MLSA digital filter coefficients" << std::endl;  // NOLINT
  *stream << std::endl;
  *stream << "  usage:" << std::endl;
  *stream << "       mc2b [ options ] [ infile ] > stdout" << std::endl;
  *stream << "  options:" << std::endl;
  *stream << "       -m m  : order of mel-cepstrum (   int)[" << std::setw(5) << std::right << kDefaultNumOrder << "][    0 <= m <=     ]" << std::endl;  // NOLINT
  *stream << "       -a a  : all-pass constant     (double)[" << std::setw(5) << std::right << kDefaultAlpha    << "][ -1.0 <  a <  1.0 ]" << std::endl;  // NOLINT
  *stream << "       -h    : print this message" << std::endl;
  *stream << "  infile:" << std::endl;
  *stream << "       mel-cepstrum                  (double)[stdin]" << std::endl;  // NOLINT
  *stream << "  stdout:" << std::endl;
  *stream << "       MLSA filter coefficients      (double)" << std::endl;
  *stream << std::endl;
  *stream << " SPTK: version " << sptk::kVersion << std::endl;
  *stream << std::endl;
  // clang-format on
}